

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::GaussianNoise::forward_impl
          (GaussianNoise *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  Index index;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [64];
  Tensor m;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_d8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_b8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_98;
  undefined1 local_78 [48];
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_48;
  
  local_78._32_4_ = (this->super_Node).dim.bd;
  local_78._40_8_ = (this->super_Node).aux_mem;
  local_78._0_8_ = *(undefined8 *)(this->super_Node).dim.d;
  local_78._8_8_ = *(undefined8 *)((this->super_Node).dim.d + 2);
  local_78._16_8_ = *(undefined8 *)((this->super_Node).dim.d + 4);
  local_78._24_8_ = *(undefined8 *)((this->super_Node).dim.d + 6);
  local_48.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  local_48.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TensorTools::RandomizeNormal(0.0,this->stddev,(Tensor *)local_78);
  Tensor::operator*(&local_98,
                    *(xs->
                     super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  Tensor::operator*(&local_b8,(Tensor *)local_78);
  if ((local_98.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value !=
       local_b8.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value) ||
     (local_98.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value !=
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value)) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, -1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
                 );
  }
  Tensor::operator*(&local_d8,fx);
  if ((local_d8.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value ==
       local_b8.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value) &&
     (local_d8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value ==
      local_b8.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value)) {
    uVar6 = local_b8.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_cols.m_value *
            local_b8.
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
            .
            super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
            .m_rows.m_value;
    uVar1 = uVar6;
    if ((((ulong)local_d8.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar1 = (ulong)(-((uint)((ulong)local_d8.
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                        .
                                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                        .m_data >> 2) & 0x3fffffff) & 0xf),
       (long)uVar6 <= (long)uVar1)) {
      uVar1 = uVar6;
    }
    uVar4 = uVar6 - uVar1;
    uVar2 = uVar4 + 0xf;
    if (-1 < (long)uVar4) {
      uVar2 = uVar4;
    }
    if (0 < (long)uVar1) {
      uVar5 = 0;
      do {
        local_d8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar5] =
             local_b8.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data[uVar5] +
             local_98.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    lVar3 = (uVar2 & 0xfffffffffffffff0) + uVar1;
    if (0xf < (long)uVar4) {
      do {
        auVar7 = vaddps_avx512f(*(undefined1 (*) [64])
                                 (local_b8.
                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                  .
                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                  .m_data + uVar1),
                                *(undefined1 (*) [64])
                                 (local_98.
                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                  .
                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                  .m_data + uVar1));
        *(undefined1 (*) [64])
         (local_d8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data + uVar1) = auVar7;
        uVar1 = uVar1 + 0x10;
      } while ((long)uVar1 < lVar3);
    }
    if (lVar3 < (long)uVar6) {
      do {
        local_d8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[lVar3] =
             local_b8.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data[lVar3] +
             local_98.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data[lVar3];
        lVar3 = lVar3 + 1;
      } while (uVar6 - lVar3 != 0);
    }
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_48);
    return;
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
               );
}

Assistant:

void GaussianNoise::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("GaussianNoise not yet implemented for CUDA");
#else
  Tensor m(dim, (float*)aux_mem);
  TensorTools::RandomizeNormal(0, stddev, m);
  (*fx) = **xs[0] + *m;
#endif
}